

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O1

void PaUtil_DestroyAllocationGroup(PaUtilAllocationGroup *group)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *pPVar2;
  
  pPVar2 = group->linkBlocks;
  while (pPVar2 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1 = pPVar2->next;
    PaUtil_FreeMemory(pPVar2->buffer);
    pPVar2 = pPVar1;
  }
  PaUtil_FreeMemory(group);
  return;
}

Assistant:

void PaUtil_DestroyAllocationGroup( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->linkBlocks;
    struct PaUtilAllocationGroupLink *next;

    while( current )
    {
        next = current->next;
        PaUtil_FreeMemory( current->buffer );
        current = next;
    }

    PaUtil_FreeMemory( group );
}